

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcProcedure::IfcProcedure(IfcProcedure *this)

{
  IfcProcedure *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x158,"IfcProcedure");
  IfcProcess::IfcProcess((IfcProcess *)this,&PTR_construction_vtable_24__010662a0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcedure,_3UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcedure,_3UL>,
             &PTR_construction_vtable_24__01066350);
  *(undefined8 *)this = 0x10661c0;
  *(undefined8 *)&this->field_0x158 = 0x1066288;
  *(undefined8 *)&this->field_0x88 = 0x10661e8;
  *(undefined8 *)&this->field_0x98 = 0x1066210;
  *(undefined8 *)&this->field_0xd0 = 0x1066238;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcedure,_3UL>)._vptr_ObjectHelper =
       (_func_int **)0x1066260;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcedure,_3UL>).field_0x10);
  std::__cxx11::string::string((string *)&this->ProcedureType);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->UserDefinedProcedureType);
  return;
}

Assistant:

IfcProcedure() : Object("IfcProcedure") {}